

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

JointIndex __thiscall
iDynTree::Model::addJoint
          (Model *this,string *link1,string *link2,string *jointName,IJointConstPtr joint)

{
  char *pcVar1;
  long *in_R8;
  JointIndex jntIdx;
  string error_1;
  string error;
  LinkIndex link2Index;
  LinkIndex link1Index;
  IJointPtr jointCopy;
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_d8 [24];
  undefined8 in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff70;
  Model *in_stack_ffffffffffffff78;
  string local_68 [32];
  LinkIndex local_48;
  long local_40;
  long *local_38;
  JointIndex local_8;
  
  local_38 = (long *)(**(code **)(*in_R8 + 0x10))();
  local_40 = getLinkIndex(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_48 = getLinkIndex(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (local_40 == LINK_INVALID_INDEX) {
    std::operator+(in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff40);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("Model","addJoint",pcVar1);
    local_8 = JOINT_INVALID_INDEX;
    std::__cxx11::string::~string(local_68);
  }
  else if (local_48 == LINK_INVALID_INDEX) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
    std::operator+(in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff40);
    std::operator+(__lhs,in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(local_d8);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("Model","addJoint",pcVar1);
    local_8 = JOINT_INVALID_INDEX;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  }
  else {
    (**(code **)(*local_38 + 0x28))(local_38,local_40,local_48);
    local_8 = addJoint((Model *)joint,(string *)jointCopy,(IJointConstPtr)link1Index);
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
  }
  return local_8;
}

Assistant:

JointIndex Model::addJoint(const std::string & link1, const std::string & link2,
                            const std::string & jointName, IJointConstPtr joint)
{
    IJointPtr jointCopy = joint->clone();

    LinkIndex link1Index = this->getLinkIndex(link1);
    LinkIndex link2Index = this->getLinkIndex(link2);

    if( link1Index == LINK_INVALID_INDEX )
    {
        std::string error = "a link of name " + link1 + " is not present in the model";
        reportError("Model","addJoint",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    if( link2Index == LINK_INVALID_INDEX )
    {
        std::string error = "a link of name " + link2 + " is not present in the model";
        reportError("Model","addJoint",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    jointCopy->setAttachedLinks(link1Index,link2Index);

    JointIndex jntIdx = addJoint(jointName,jointCopy);

    delete jointCopy;

    return jntIdx;
}